

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Treap.h
# Opt level: O0

pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> __thiscall
Treap<unsigned_long>::split(Treap<unsigned_long> *this,Node *ptr,unsigned_long val)

{
  undefined1 local_60 [8];
  pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> tmp_1;
  pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> tmp;
  void *local_38;
  unsigned_long local_30;
  unsigned_long val_local;
  Node *ptr_local;
  Treap<unsigned_long> *this_local;
  
  local_30 = val;
  val_local = (unsigned_long)ptr;
  ptr_local = (Node *)this;
  if (ptr == (Node *)0x0) {
    local_38 = (void *)0x0;
    tmp.second = (Node *)0x0;
    std::pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*>::
    pair<std::nullptr_t,_std::nullptr_t,_true>
              ((pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> *)&this_local,
               &local_38,&tmp.second);
  }
  else if (ptr->val < val) {
    join_0x00000010_0x00000000_ = split(this,ptr->right,val);
    *(Node **)(val_local + 0x18) = tmp_1.second;
    std::pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*>::
    pair<Treap<unsigned_long>::Node_*&,_Treap<unsigned_long>::Node_*&,_true>
              ((pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> *)&this_local,
               (Node **)&val_local,&tmp.first);
  }
  else {
    _local_60 = split(this,ptr->left,val);
    *(Node **)(val_local + 0x10) = tmp_1.first;
    std::pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*>::
    pair<Treap<unsigned_long>::Node_*&,_Treap<unsigned_long>::Node_*&,_true>
              ((pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> *)&this_local,
               (Node **)local_60,(Node **)&val_local);
  }
  return _this_local;
}

Assistant:

std::pair<Node *, Node *> split(Node *ptr, T val) {
    if (!ptr)
      return {nullptr, nullptr};

    if (val > ptr->val) {
      auto tmp = split(ptr->right, val);
      ptr->right = tmp.first;
      return {ptr, tmp.second};
    } else {
      auto tmp = split(ptr->left, val);
      ptr->left = tmp.second;
      return {tmp.first, ptr};
    }
  }